

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_server.cpp
# Opt level: O3

int __thiscall CNetServer::Recv(CNetServer *this,CNetChunk *pChunk,TOKEN *pResponseToken)

{
  CNetRecvUnpacker *this_00;
  CNetPacketConstruct *pPacket;
  uchar *puVar1;
  NETADDR *pNVar2;
  uint uVar3;
  undefined8 uVar4;
  uchar uVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  TOKEN TVar12;
  NETADDR *a;
  CNetConnection *this_01;
  long lVar13;
  long in_FS_OFFSET;
  int LastInfoQuery;
  char FullMsg [20];
  char aBuf [128];
  NETADDR Addr;
  int local_15c;
  char local_158 [128];
  char local_d8 [136];
  NETADDR local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->m_RecvUnpacker;
  pPacket = &(this->m_RecvUnpacker).m_Data;
  puVar1 = (this->m_RecvUnpacker).m_Data.m_aChunkData;
  pNVar2 = &this->m_aSlots[0].m_Connection.m_PeerAddr;
LAB_001c8a90:
  do {
    if ((this_00->m_Valid == true) &&
       (iVar10 = CNetRecvUnpacker::FetchChunk(this_00,pChunk), iVar10 != 0)) goto LAB_001c8df0;
    iVar10 = CNetBase::UnpackPacket
                       (&this->super_CNetBase,&local_50,(this->m_RecvUnpacker).m_aBuffer,pPacket);
    if (0 < iVar10) {
      iVar10 = 0;
      goto LAB_001c8df5;
    }
    if (iVar10 == 0) {
      if ((this->m_pNetBan == (CNetBan *)0x0) ||
         (bVar9 = CNetBan::IsBanned(this->m_pNetBan,(NETADDR_conflict *)&local_50,local_d8,0x80,
                                    &local_15c), !bVar9)) {
        lVar13 = 0;
        bVar9 = false;
        a = pNVar2;
        do {
          if ((*(int *)(a[-0x59f].ip + 4) != 0) &&
             (iVar10 = net_addr_comp(a,&local_50,1), iVar10 == 0)) {
            iVar10 = CNetConnection::Feed((CNetConnection *)(a + -0x59f),pPacket,&local_50);
            bVar9 = true;
            if ((iVar10 != 0) && ((this->m_RecvUnpacker).m_Data.m_DataSize != 0)) {
              if (((this->m_RecvUnpacker).m_Data.m_Flags & 8) != 0) {
                pChunk->m_Flags = 2;
                uVar5 = a->ip[0];
                uVar6 = a->ip[1];
                uVar7 = a->ip[2];
                uVar8 = a->ip[3];
                uVar4 = *(undefined8 *)(a->ip + 4);
                (pChunk->m_Address).type = a->type;
                (pChunk->m_Address).ip[0] = uVar5;
                (pChunk->m_Address).ip[1] = uVar6;
                (pChunk->m_Address).ip[2] = uVar7;
                (pChunk->m_Address).ip[3] = uVar8;
                *(undefined8 *)((pChunk->m_Address).ip + 4) = uVar4;
                *(undefined8 *)((pChunk->m_Address).ip + 0xc) = *(undefined8 *)(a->ip + 0xc);
                pChunk->m_ClientID = (int)lVar13;
                pChunk->m_DataSize = (this->m_RecvUnpacker).m_Data.m_DataSize;
                pChunk->m_pData = puVar1;
                TVar12 = 0xffffffff;
                if (pResponseToken == (TOKEN *)0x0) goto LAB_001c8df0;
                goto LAB_001c8dee;
              }
              CNetRecvUnpacker::Start(this_00,&local_50,(CNetConnection *)(a + -0x59f),(int)lVar13);
            }
          }
          lVar13 = lVar13 + 1;
          a = a + 0x5a1;
        } while (lVar13 != 0x40);
        if ((!bVar9) &&
           (iVar10 = CNetTokenManager::ProcessMessage(&this->m_TokenManager,&local_50,pPacket),
           0 < iVar10)) {
          uVar3 = (this->m_RecvUnpacker).m_Data.m_Flags;
          if ((uVar3 & 1) == 0) {
            if ((uVar3 & 8) != 0) {
              pChunk->m_Flags = 2;
              pChunk->m_ClientID = -1;
              (pChunk->m_Address).type = local_50.type;
              (pChunk->m_Address).ip[0] = local_50.ip[0];
              (pChunk->m_Address).ip[1] = local_50.ip[1];
              (pChunk->m_Address).ip[2] = local_50.ip[2];
              (pChunk->m_Address).ip[3] = local_50.ip[3];
              *(undefined8 *)((pChunk->m_Address).ip + 4) = local_50.ip._4_8_;
              *(undefined8 *)((pChunk->m_Address).ip + 0xc) = local_50._16_8_;
              pChunk->m_DataSize = (this->m_RecvUnpacker).m_Data.m_DataSize;
              pChunk->m_pData = puVar1;
              if (pResponseToken != (TOKEN *)0x0) {
                TVar12 = (this->m_RecvUnpacker).m_Data.m_ResponseToken;
LAB_001c8dee:
                *pResponseToken = TVar12;
              }
LAB_001c8df0:
              iVar10 = 1;
LAB_001c8df5:
              if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
                __stack_chk_fail();
              }
              return iVar10;
            }
          }
          else if (*puVar1 == '\x05') {
            CNetTokenCache::AddToken
                      (&this->m_TokenCache,&local_50,(this->m_RecvUnpacker).m_Data.m_ResponseToken,2
                      );
          }
          else if (*puVar1 == '\x01') {
            if (this->m_NumClients < this->m_MaxClients) {
              iVar10 = 1;
              lVar13 = 0;
              do {
                if ((*(int *)(this->m_aSlots[0].m_Connection.m_Buffer.m_aBuffer + lVar13 + -0x38) !=
                     0) && (iVar11 = net_addr_comp(&local_50,(NETADDR *)(pNVar2->ip + lVar13 + -4),0
                                                  ), iVar11 == 0)) {
                  if (this->m_MaxClientsPerIP <= iVar10) {
                    str_format(local_158,0x80,"Only %d players with the same IP are allowed");
                    TVar12 = (this->m_RecvUnpacker).m_Data.m_ResponseToken;
                    iVar10 = str_length(local_158);
                    CNetBase::SendControlMsg
                              (&this->super_CNetBase,&local_50,TVar12,0,4,local_158,iVar10 + 1);
                    goto LAB_001c8a90;
                  }
                  iVar10 = iVar10 + 1;
                }
                lVar13 = lVar13 + 0x8718;
              } while (lVar13 != 0x21c600);
              lVar13 = 0;
              this_01 = &this->m_aSlots[0].m_Connection;
              do {
                if (this_01->m_State == 0) {
                  this->m_NumClients = this->m_NumClients + 1;
                  CNetConnection::SetToken(this_01,(this->m_RecvUnpacker).m_Data.m_Token);
                  CNetConnection::Feed(this_01,pPacket,&local_50);
                  if (this->m_pfnNewClient != (NETFUNC_NEWCLIENT)0x0) {
                    (*this->m_pfnNewClient)((int)lVar13,this->m_UserPtr);
                  }
                  break;
                }
                lVar13 = lVar13 + 1;
                this_01 = this_01 + 1;
              } while (lVar13 != 0x40);
            }
            else {
              builtin_strncpy(local_158,"This server is full",0x14);
              CNetBase::SendControlMsg
                        (&this->super_CNetBase,&local_50,
                         (this->m_RecvUnpacker).m_Data.m_ResponseToken,0,4,local_158,0x14);
            }
          }
        }
      }
      else {
        iVar10 = time_timestamp();
        if (local_15c + 5 < iVar10) {
          TVar12 = (this->m_RecvUnpacker).m_Data.m_ResponseToken;
          iVar10 = str_length(local_d8);
          CNetBase::SendControlMsg(&this->super_CNetBase,&local_50,TVar12,0,4,local_d8,iVar10 + 1);
        }
      }
    }
  } while( true );
}

Assistant:

int CNetServer::Recv(CNetChunk *pChunk, TOKEN *pResponseToken)
{
	while(1)
	{
		// check for a chunk
		if(m_RecvUnpacker.IsActive() && m_RecvUnpacker.FetchChunk(pChunk))
			return 1;

		// TODO: empty the recvinfo
		NETADDR Addr;
		int Result = UnpackPacket(&Addr, m_RecvUnpacker.m_aBuffer, &m_RecvUnpacker.m_Data);
		// no more packets for now
		if(Result > 0)
			break;

		if(!Result)
		{
			// check for bans
			char aBuf[128];
			int LastInfoQuery;
			if(NetBan() && NetBan()->IsBanned(&Addr, aBuf, sizeof(aBuf), &LastInfoQuery))
			{
				// banned, reply with a message (5 second cooldown)
				int Time = time_timestamp();
				if(LastInfoQuery + 5 < Time)
				{
					SendControlMsg(&Addr, m_RecvUnpacker.m_Data.m_ResponseToken, 0, NET_CTRLMSG_CLOSE, aBuf, str_length(aBuf) + 1);
				}
				continue;
			}

			bool Found = false;
			// try to find matching slot
			for(int i = 0; i < NET_MAX_CLIENTS; i++)
			{
				if(m_aSlots[i].m_Connection.State() == NET_CONNSTATE_OFFLINE)
					continue;

				if(net_addr_comp(m_aSlots[i].m_Connection.PeerAddress(), &Addr, true) == 0)
				{
					if(m_aSlots[i].m_Connection.Feed(&m_RecvUnpacker.m_Data, &Addr))
					{
						if(m_RecvUnpacker.m_Data.m_DataSize)
						{
							if(!(m_RecvUnpacker.m_Data.m_Flags&NET_PACKETFLAG_CONNLESS))
								m_RecvUnpacker.Start(&Addr, &m_aSlots[i].m_Connection, i);
							else
							{
								pChunk->m_Flags = NETSENDFLAG_CONNLESS;
								pChunk->m_Address = *m_aSlots[i].m_Connection.PeerAddress();
								pChunk->m_ClientID = i;
								pChunk->m_DataSize = m_RecvUnpacker.m_Data.m_DataSize;
								pChunk->m_pData = m_RecvUnpacker.m_Data.m_aChunkData;
								if(pResponseToken)
									*pResponseToken = NET_TOKEN_NONE;
								return 1;
							}
						}
					}
					Found = true;
				}
			}

			if(Found)
				continue;

			int Accept = m_TokenManager.ProcessMessage(&Addr, &m_RecvUnpacker.m_Data);
			if(Accept <= 0)
				continue;

			if(m_RecvUnpacker.m_Data.m_Flags&NET_PACKETFLAG_CONTROL)
			{
				if(m_RecvUnpacker.m_Data.m_aChunkData[0] == NET_CTRLMSG_CONNECT)
				{
					// check if there are free slots
					if(m_NumClients >= m_MaxClients)
					{
						const char FullMsg[] = "This server is full";
						SendControlMsg(&Addr, m_RecvUnpacker.m_Data.m_ResponseToken, 0, NET_CTRLMSG_CLOSE, FullMsg, sizeof(FullMsg));
						continue;
					}

					// only allow a specific number of players with the same ip
					int FoundAddr = 1;
					
					bool Continue = false;
					for(int i = 0; i < NET_MAX_CLIENTS; i++)
					{
						if(m_aSlots[i].m_Connection.State() == NET_CONNSTATE_OFFLINE)
							continue;

						if(!net_addr_comp(&Addr, m_aSlots[i].m_Connection.PeerAddress(), false))
						{
							if(FoundAddr++ >= m_MaxClientsPerIP)
							{
								char aBuf[128];
								str_format(aBuf, sizeof(aBuf), "Only %d players with the same IP are allowed", m_MaxClientsPerIP);
								SendControlMsg(&Addr, m_RecvUnpacker.m_Data.m_ResponseToken, 0, NET_CTRLMSG_CLOSE, aBuf, str_length(aBuf) + 1);
								Continue = true;
								break;
							}
						}
					}

					if(Continue)
						continue;

					for(int i = 0; i < NET_MAX_CLIENTS; i++)
					{
						if(m_aSlots[i].m_Connection.State() == NET_CONNSTATE_OFFLINE)
						{
							m_NumClients++;
							m_aSlots[i].m_Connection.SetToken(m_RecvUnpacker.m_Data.m_Token);
							m_aSlots[i].m_Connection.Feed(&m_RecvUnpacker.m_Data, &Addr);
							if(m_pfnNewClient)
								m_pfnNewClient(i, m_UserPtr);
							break;
						}
					}
				}
				else if(m_RecvUnpacker.m_Data.m_aChunkData[0] == NET_CTRLMSG_TOKEN)
					m_TokenCache.AddToken(&Addr, m_RecvUnpacker.m_Data.m_ResponseToken, NET_TOKENFLAG_RESPONSEONLY);
			}
			else if(m_RecvUnpacker.m_Data.m_Flags&NET_PACKETFLAG_CONNLESS)
			{
				pChunk->m_Flags = NETSENDFLAG_CONNLESS;
				pChunk->m_ClientID = -1;
				pChunk->m_Address = Addr;
				pChunk->m_DataSize = m_RecvUnpacker.m_Data.m_DataSize;
				pChunk->m_pData = m_RecvUnpacker.m_Data.m_aChunkData;
				if(pResponseToken)
					*pResponseToken = m_RecvUnpacker.m_Data.m_ResponseToken;
				return 1;
			}
		}
	}
	return 0;
}